

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int is_builtin(char *key,int keylen)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0x128) break;
    iVar2 = strncmp(key,*(char **)((long)is_builtin::builtins + lVar3),(long)keylen);
    lVar1 = lVar3 + 8;
  } while (iVar2 != 0);
  return (int)(lVar3 != 0x128);
}

Assistant:

static int is_builtin(char *key, int keylen)
{
	static char *builtins[] = {"alloca",
				   "int64_t",
				   "lua_Number",
				   "lua_Integer",
				   "TValue",
				   "ivalue",
				   "setivalue",
				   "fvalue",
				   "setfltvalue",
				   "Ravi_Arr",
				   "arrvalue",
				   "ttisfulluserdata",
				   "ttislightuserdata",
				   "ttisstring",
				   "uvalue",
				   "pvalue",
				   "svalue",
				   "getudatamem",
				   "gco2u",
				   "sizeudata",
				   "vslen",
				   "R",
				   "Ravi_StringOrUserData",
				   "Ravi_IntegerArray",
				   "Ravi_NumberArray",
				   "raviX__error_code",
				   "LUA_TBOOLEAN",
				   "LUA_TNIL",
				   "LUA_TNUMBER",
				   "LUA_TUSERDATA",
				   "LUA_TLIGHTUSERDATA",
				   "LUA_TTHREAD",
				   "LUA_TTABLE",
				   "LUA_TFUNCTION",
				   "LUA_TSTRING",
				   "LUA_TTABLE",
				   "settt_",
				   NULL};
	for (int i = 0; builtins[i]; i++) {
		if (strncmp(key, builtins[i], keylen) == 0) {
			return 1;
		}
	}
	return 0;
}